

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Index coda_XML_GetCurrentByteIndex(XML_Parser parser)

{
  XML_Parser parser_local;
  
  if (parser == (XML_Parser)0x0) {
    parser_local = (XML_Parser)0xffffffffffffffff;
  }
  else if (parser->m_eventPtr == (char *)0x0) {
    parser_local = (XML_Parser)0xffffffffffffffff;
  }
  else {
    parser_local = (XML_Parser)
                   (parser->m_parseEndByteIndex -
                   ((long)parser->m_parseEndPtr - (long)parser->m_eventPtr));
  }
  return (XML_Index)parser_local;
}

Assistant:

XML_Index XMLCALL
XML_GetCurrentByteIndex(XML_Parser parser) {
  if (parser == NULL)
    return -1;
  if (parser->m_eventPtr)
    return (XML_Index)(parser->m_parseEndByteIndex
                       - (parser->m_parseEndPtr - parser->m_eventPtr));
  return -1;
}